

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall GlobOpt::CannotAllocateArgumentsObjectOnStack(GlobOpt *this,Func *curFunc)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *pJVar3;
  FunctionJITTimeInfo *pFVar4;
  char16 *pcVar5;
  char16 *pcVar6;
  JITOutputIDL *pJVar7;
  undefined4 *puVar8;
  undefined1 *puVar9;
  wchar local_78 [4];
  char16 debugStringBuffer [42];
  
  if ((curFunc != (Func *)0x0) && ((curFunc->field_0x240 & 0x80) != 0)) {
    pJVar7 = JITOutput::GetOutputData(&curFunc->m_output);
    if (pJVar7->disableStackArgOpt != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3f02,"(!curFunc->GetJITOutput()->GetOutputData()->disableStackArgOpt)",
                         "!curFunc->GetJITOutput()->GetOutputData()->disableStackArgOpt");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
    pJVar7 = JITOutput::GetOutputData(&curFunc->m_output);
    pJVar7->disableStackArgOpt = '\x01';
    puVar9 = (undefined1 *)__cxa_allocate_exception(1);
    *puVar9 = 0x2b;
    __cxa_throw(puVar9,&Js::RejitException::typeinfo,0);
  }
  puVar9 = &this->func->field_0x240;
  *(uint *)puVar9 = *(uint *)puVar9 & 0xffffffbf;
  pJVar3 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar3);
  pFVar4 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(pFVar4);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,StackArgOptPhase,sourceContextId,functionId)
  ;
  if (bVar2) {
    pJVar3 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar5 = JITTimeFunctionBody::GetDisplayName(pJVar3);
    pFVar4 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar6 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar4,(wchar (*) [42])local_78);
    Output::Print(L"Stack args disabled for function %s(%s)\n",pcVar5,pcVar6);
    Output::Flush();
  }
  return;
}

Assistant:

void
GlobOpt::CannotAllocateArgumentsObjectOnStack(Func * curFunc)
{
    if (curFunc != nullptr && curFunc->hasArgLenAndConstOpt)
    {
        Assert(!curFunc->GetJITOutput()->GetOutputData()->disableStackArgOpt);
        curFunc->GetJITOutput()->GetOutputData()->disableStackArgOpt = true;
        throw Js::RejitException(RejitReason::DisableStackArgLenAndConstOpt);
    }

    func->SetHasStackArgs(false);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (PHASE_TESTTRACE(Js::StackArgOptPhase, this->func))
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(_u("Stack args disabled for function %s(%s)\n"), func->GetJITFunctionBody()->GetDisplayName(), func->GetDebugNumberSet(debugStringBuffer));
        Output::Flush();
    }
#endif
}